

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O2

void __thiscall Imf_2_5::Header::sanityCheck(Header *this,bool isTiled,bool isMultipartFile)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  LineOrder LVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  Box2i *pBVar10;
  int *piVar11;
  float *pfVar12;
  string *psVar13;
  LineOrder *pLVar14;
  TileDescription *pTVar15;
  Compression *pCVar16;
  ChannelList *this_00;
  const_iterator cVar17;
  ConstIterator CVar18;
  ostream *poVar19;
  ArgExc *pAVar20;
  char *pcVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1d8;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  pBVar10 = displayWindow(this);
  iVar1 = (pBVar10->min).x;
  iVar2 = (pBVar10->max).x;
  if (((((iVar2 < iVar1) || (iVar3 = (pBVar10->max).y, 0x3ffffffe < iVar3)) || (0x3ffffffe < iVar2))
      || ((iVar2 = (pBVar10->min).y, iVar2 < -0x3ffffffe || (iVar1 < -0x3ffffffe)))) ||
     (iVar3 < iVar2)) {
    pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar21 = "Invalid display window in image header.";
    goto LAB_00113ccc;
  }
  pBVar10 = dataWindow(this);
  iVar1 = (pBVar10->min).x;
  iVar2 = (pBVar10->max).x;
  if (((iVar1 <= iVar2) && (iVar3 = (pBVar10->max).y, iVar3 < 0x3fffffff)) && (iVar2 < 0x3fffffff))
  {
    iVar4 = (pBVar10->min).y;
    if (((-0x3fffffff < iVar4) && (-0x3fffffff < iVar1)) && (iVar4 <= iVar3)) {
      if ((anonymous_namespace)::maxImageWidth <= iVar2 - iVar1 &&
          0 < (anonymous_namespace)::maxImageWidth) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar19 = std::operator<<(local_1a8,
                                  "The width of the data window exceeds the maximum width of ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,(anonymous_namespace)::maxImageWidth);
        std::operator<<(poVar19,"pixels.");
        pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      if (0 < (anonymous_namespace)::maxImageHeight) {
        if ((anonymous_namespace)::maxImageHeight <= iVar3 - iVar4) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          poVar19 = std::operator<<(local_1a8,
                                    "The height of the data window exceeds the maximum height of ");
          poVar19 = (ostream *)
                    std::ostream::operator<<(poVar19,(anonymous_namespace)::maxImageHeight);
          std::operator<<(poVar19,"pixels.");
          pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
          __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        if (0 < (anonymous_namespace)::maxImageWidth) {
          bVar8 = hasChunkCount(this);
          if (bVar8) {
            piVar11 = chunkCount(this);
            if ((ulong)((long)(anonymous_namespace)::maxImageHeight *
                       (long)(anonymous_namespace)::maxImageWidth) < (ulong)(long)*piVar11) {
              iex_debugTrap();
              std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
              poVar19 = std::operator<<(local_1a8,"chunkCount exceeds maximum area of ");
              poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
              std::operator<<(poVar19," pixels.");
              pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
              __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
            }
          }
        }
      }
      pfVar12 = pixelAspectRatio(this);
      fVar5 = *pfVar12;
      if (((fVar5 <= 1e+06) && (1e-06 <= fVar5)) && ((int)ABS(fVar5) - 0x800000U < 0x7f000000)) {
        pfVar12 = screenWindowWidth(this);
        if (*pfVar12 <= 0.0 && *pfVar12 != 0.0) {
          pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
          pcVar21 = "Invalid screen window width in image header.";
          goto LAB_00113ccc;
        }
        if (isMultipartFile) {
          bVar8 = hasName(this);
          if (!bVar8) {
            pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
            pcVar21 = "Headers in a multipart file should have name attribute.";
            goto LAB_00113ccc;
          }
          bVar8 = hasType(this);
          if (!bVar8) {
            pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
            pcVar21 = "Headers in a multipart file should have type attribute.";
            goto LAB_00113ccc;
          }
        }
        bVar8 = hasType(this);
        if (bVar8) {
          psVar13 = type_abi_cxx11_(this);
          std::__cxx11::string::string((string *)&bStack_1d8,(string *)psVar13);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&bStack_1d8,"",(allocator<char> *)&_iex_throw_s);
        }
        bVar8 = std::operator!=(&bStack_1d8,"");
        if (bVar8) {
          bVar8 = isSupportedType(&bStack_1d8);
          if (!bVar8) goto LAB_001136da;
        }
        bVar8 = isDeepData(&bStack_1d8);
        pLVar14 = lineOrder(this);
        LVar6 = *pLVar14;
        if (isTiled) {
          bVar9 = hasTileDescription(this);
          if (!bVar9) {
            pcVar21 = "Tiled image has no tile description attribute.";
            goto LAB_00113e2e;
          }
          pTVar15 = tileDescription(this);
          uVar7 = pTVar15->xSize;
          pcVar21 = "Invalid tile size in image header.";
          if (((uVar7 == 0) || ((int)uVar7 < 0)) || ((int)pTVar15->ySize < 1)) {
LAB_00113dfb:
            pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar20,pcVar21);
            __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          if ((anonymous_namespace)::maxTileWidth < (int)uVar7 &&
              0 < (anonymous_namespace)::maxTileWidth) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            poVar19 = std::operator<<(local_1a8,
                                      "The width of the tiles exceeds the maximum width of ");
            poVar19 = (ostream *)
                      std::ostream::operator<<(poVar19,(anonymous_namespace)::maxTileWidth);
            std::operator<<(poVar19,"pixels.");
            pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
            __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          if ((anonymous_namespace)::maxTileHeight < (int)pTVar15->ySize &&
              0 < (anonymous_namespace)::maxTileHeight) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            poVar19 = std::operator<<(local_1a8,
                                      "The width of the tiles exceeds the maximum width of ");
            poVar19 = (ostream *)
                      std::ostream::operator<<(poVar19,(anonymous_namespace)::maxTileHeight);
            std::operator<<(poVar19,"pixels.");
            pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
            __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          if (RIPMAP_LEVELS < pTVar15->mode) {
            pcVar21 = "Invalid level mode in image header.";
            goto LAB_00113dfb;
          }
          if (ROUND_UP < pTVar15->roundingMode) {
            pcVar21 = "Invalid level rounding mode in image header.";
            goto LAB_00113dfb;
          }
          if (RANDOM_Y < LVar6) {
            pcVar21 = "Invalid line order in image header.";
            goto LAB_00113dfb;
          }
          getTiledChunkOffsetTableSize(this);
        }
        else if (DECREASING_Y < LVar6) {
          pcVar21 = "Invalid line order in image header.";
          goto LAB_00113e2e;
        }
        pCVar16 = compression(this);
        bVar9 = isValidCompression(*pCVar16);
        if (bVar9) {
          if (bVar8) {
            pCVar16 = compression(this);
            bVar9 = isValidDeepCompression(*pCVar16);
            if (!bVar9) {
              pcVar21 = "Compression type in header not valid for deep data";
              goto LAB_00113e2e;
            }
          }
          this_00 = channels(this);
          if (bVar8 || isTiled) {
            cVar17._M_node = (_Base_ptr)ChannelList::begin(this_00);
            while( true ) {
              CVar18 = ChannelList::end(this_00);
              if ((const_iterator)cVar17._M_node == CVar18._i._M_node) break;
              if (2 < cVar17._M_node[9]._M_color) {
                iex_debugTrap();
                std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
                poVar19 = std::operator<<(local_1a8,"Pixel type of \"");
                poVar19 = std::operator<<(poVar19,(char *)(cVar17._M_node + 1));
                std::operator<<(poVar19,"\" image channel is invalid.");
                pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
                __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
              }
              if (*(int *)&cVar17._M_node[9].field_0x4 != 1) {
                iex_debugTrap();
                std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
                poVar19 = std::operator<<(local_1a8,"The x subsampling factor for the \"");
                poVar19 = std::operator<<(poVar19,(char *)(cVar17._M_node + 1));
                std::operator<<(poVar19,"\" channel is not 1.");
                pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
                __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
              }
              if (*(int *)&cVar17._M_node[9]._M_parent != 1) {
                iex_debugTrap();
                std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
                poVar19 = std::operator<<(local_1a8,"The y subsampling factor for the \"");
                poVar19 = std::operator<<(poVar19,(char *)(cVar17._M_node + 1));
                std::operator<<(poVar19,"\" channel is not 1.");
                pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
                __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
              }
              cVar17._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar17._M_node);
            }
          }
          else {
            cVar17._M_node = (_Base_ptr)ChannelList::begin(this_00);
            while( true ) {
              CVar18 = ChannelList::end(this_00);
              if ((const_iterator)cVar17._M_node == CVar18._i._M_node) break;
              if (2 < cVar17._M_node[9]._M_color) {
                iex_debugTrap();
                std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
                poVar19 = std::operator<<(local_1a8,"Pixel type of \"");
                poVar19 = std::operator<<(poVar19,(char *)(cVar17._M_node + 1));
                std::operator<<(poVar19,"\" image channel is invalid.");
                pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
                __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
              }
              iVar1 = *(int *)&cVar17._M_node[9].field_0x4;
              if (iVar1 < 1) {
                iex_debugTrap();
                std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
                poVar19 = std::operator<<(local_1a8,"The x subsampling factor for the \"");
                poVar19 = std::operator<<(poVar19,(char *)(cVar17._M_node + 1));
                std::operator<<(poVar19,"\" channel is invalid.");
                pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
                __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
              }
              iVar2 = *(int *)&cVar17._M_node[9]._M_parent;
              if (iVar2 < 1) {
                iex_debugTrap();
                std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
                poVar19 = std::operator<<(local_1a8,"The y subsampling factor for the \"");
                poVar19 = std::operator<<(poVar19,(char *)(cVar17._M_node + 1));
                std::operator<<(poVar19,"\" channel is invalid.");
                pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
                __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
              }
              iVar3 = (pBVar10->min).x;
              if (iVar3 % iVar1 != 0) {
                iex_debugTrap();
                std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
                poVar19 = std::operator<<(local_1a8,
                                          "The minimum x coordinate of the image\'s data window is not a multiple of the x subsampling factor of the \""
                                         );
                poVar19 = std::operator<<(poVar19,(char *)(cVar17._M_node + 1));
                std::operator<<(poVar19,"\" channel.");
                pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
                __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
              }
              iVar4 = (pBVar10->min).y;
              if (iVar4 % iVar2 != 0) {
                iex_debugTrap();
                std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
                poVar19 = std::operator<<(local_1a8,
                                          "The minimum y coordinate of the image\'s data window is not a multiple of the y subsampling factor of the \""
                                         );
                poVar19 = std::operator<<(poVar19,(char *)(cVar17._M_node + 1));
                std::operator<<(poVar19,"\" channel.");
                pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
                __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
              }
              if ((((pBVar10->max).x - iVar3) + 1) % iVar1 != 0) {
                iex_debugTrap();
                std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
                poVar19 = std::operator<<(local_1a8,
                                          "Number of pixels per row in the image\'s data window is not a multiple of the x subsampling factor of the \""
                                         );
                poVar19 = std::operator<<(poVar19,(char *)(cVar17._M_node + 1));
                std::operator<<(poVar19,"\" channel.");
                pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
                __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
              }
              if ((((pBVar10->max).y - iVar4) + 1) % iVar2 != 0) {
                iex_debugTrap();
                std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
                poVar19 = std::operator<<(local_1a8,
                                          "Number of pixels per column in the image\'s data window is not a multiple of the y subsampling factor of the \""
                                         );
                poVar19 = std::operator<<(poVar19,(char *)(cVar17._M_node + 1));
                std::operator<<(poVar19,"\" channel.");
                pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_2_5::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
                __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
              }
              cVar17._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar17._M_node);
            }
          }
LAB_001136da:
          std::__cxx11::string::~string((string *)&bStack_1d8);
          return;
        }
        pcVar21 = "Unknown compression type in image header.";
LAB_00113e2e:
        pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar20,pcVar21);
        __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
      pcVar21 = "Invalid pixel aspect ratio in image header.";
      goto LAB_00113ccc;
    }
  }
  pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
  pcVar21 = "Invalid data window in image header.";
LAB_00113ccc:
  Iex_2_5::ArgExc::ArgExc(pAVar20,pcVar21);
  __cxa_throw(pAVar20,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void		
Header::sanityCheck (bool isTiled, bool isMultipartFile) const
{
    //
    // The display window and the data window must each
    // contain at least one pixel.  In addition, the
    // coordinates of the window corners must be small
    // enough to keep expressions like max-min+1 or
    // max+min from overflowing.
    //

    const Box2i &displayWindow = this->displayWindow();

    if (displayWindow.min.x > displayWindow.max.x ||
	displayWindow.min.y > displayWindow.max.y ||
	displayWindow.min.x <= -(INT_MAX / 2) ||
	displayWindow.min.y <= -(INT_MAX / 2) ||
	displayWindow.max.x >=  (INT_MAX / 2) ||
	displayWindow.max.y >=  (INT_MAX / 2))
    {
	throw IEX_NAMESPACE::ArgExc ("Invalid display window in image header.");
    }

    const Box2i &dataWindow = this->dataWindow();

    if (dataWindow.min.x > dataWindow.max.x ||
	dataWindow.min.y > dataWindow.max.y ||
	dataWindow.min.x <= -(INT_MAX / 2) ||
	dataWindow.min.y <= -(INT_MAX / 2) ||
	dataWindow.max.x >=  (INT_MAX / 2) ||
	dataWindow.max.y >=  (INT_MAX / 2))
    {
	throw IEX_NAMESPACE::ArgExc ("Invalid data window in image header.");
    }

    int w = (dataWindow.max.x - dataWindow.min.x + 1);
    if (maxImageWidth > 0 && maxImageWidth < w)
    {
	THROW (IEX_NAMESPACE::ArgExc, "The width of the data window exceeds the "
			    "maximum width of " << maxImageWidth << "pixels.");
    }

    int h = (dataWindow.max.y - dataWindow.min.y + 1);
    if (maxImageHeight > 0 && maxImageHeight < h)
    {
	THROW (IEX_NAMESPACE::ArgExc, "The height of the data window exceeds the "
			    "maximum height of " << maxImageHeight << "pixels.");
    }

    // chunk table must be smaller than the maximum image area
    // (only reachable for unknown types or damaged files: will have thrown earlier
    //  for regular image types)
    if( maxImageHeight>0 && maxImageWidth>0 && 
	hasChunkCount() && static_cast<Int64>(chunkCount())>Int64(maxImageWidth)*Int64(maxImageHeight))
    {
	THROW (IEX_NAMESPACE::ArgExc, "chunkCount exceeds maximum area of "
	       << Int64(maxImageWidth)*Int64(maxImageHeight) << " pixels." );
       
    }


    //
    // The pixel aspect ratio must be greater than 0.
    // In applications, numbers like the the display or
    // data window dimensions are likely to be multiplied
    // or divided by the pixel aspect ratio; to avoid
    // arithmetic exceptions, we limit the pixel aspect
    // ratio to a range that is smaller than theoretically
    // possible (real aspect ratios are likely to be close
    // to 1.0 anyway).
    //

    float pixelAspectRatio = this->pixelAspectRatio();

    const float MIN_PIXEL_ASPECT_RATIO = 1e-6f;
    const float MAX_PIXEL_ASPECT_RATIO = 1e+6f;

    if (!std::isnormal(pixelAspectRatio) ||
        pixelAspectRatio < MIN_PIXEL_ASPECT_RATIO ||
        pixelAspectRatio > MAX_PIXEL_ASPECT_RATIO)
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid pixel aspect ratio in image header.");
    }

    //
    // The screen window width must not be less than 0.
    // The size of the screen window can vary over a wide
    // range (fish-eye lens to astronomical telescope),
    // so we can't limit the screen window width to a
    // small range.
    //

    float screenWindowWidth = this->screenWindowWidth();

    if (screenWindowWidth < 0)
	throw IEX_NAMESPACE::ArgExc ("Invalid screen window width in image header.");

    //
    // If the file has multiple parts, verify that each header has attribute
    // name and type.
    // (TODO) We may want to check more stuff here.
    //

    if (isMultipartFile)
    {
        if (!hasName())
        {
            throw IEX_NAMESPACE::ArgExc ("Headers in a multipart file should"
                               " have name attribute.");
        }

        if (!hasType())
        {
            throw IEX_NAMESPACE::ArgExc ("Headers in a multipart file should"
                               " have type attribute.");
        }

    }
    
    const std::string & part_type=hasType() ? type() : "";

    
    if(part_type!="" && !isSupportedType(part_type))
    {
        //
        // skip remaining sanity checks with unsupported types - they may not hold
        //
        return;
    }
    
    bool isDeep = isDeepData(part_type);
   
    //
    // If the file is tiled, verify that the tile description has reasonable
    // values and check to see if the lineOrder is one of the predefined 3.
    // If the file is not tiled, then the lineOrder can only be INCREASING_Y
    // or DECREASING_Y.
    //

    LineOrder lineOrder = this->lineOrder();

    if (isTiled)
    {
        if (!hasTileDescription())
        {
            throw IEX_NAMESPACE::ArgExc ("Tiled image has no tile "
                        "description attribute.");
        }

        const TileDescription &tileDesc = tileDescription();

        if (tileDesc.xSize <= 0 || tileDesc.ySize <= 0 || tileDesc.xSize > INT_MAX || tileDesc.ySize > INT_MAX )
            throw IEX_NAMESPACE::ArgExc ("Invalid tile size in image header.");

        if (maxTileWidth > 0 &&
            maxTileWidth < int(tileDesc.xSize))
        {
            THROW (IEX_NAMESPACE::ArgExc, "The width of the tiles exceeds the maximum "
                    "width of " << maxTileWidth << "pixels.");
        }

        if (maxTileHeight > 0 &&
            maxTileHeight < int(tileDesc.ySize))
        {
            THROW (IEX_NAMESPACE::ArgExc, "The width of the tiles exceeds the maximum "
                    "width of " << maxTileHeight << "pixels.");
        }

        if (tileDesc.mode != ONE_LEVEL &&
            tileDesc.mode != MIPMAP_LEVELS &&
            tileDesc.mode != RIPMAP_LEVELS)
            throw IEX_NAMESPACE::ArgExc ("Invalid level mode in image header.");

        if (tileDesc.roundingMode != ROUND_UP &&
            tileDesc.roundingMode != ROUND_DOWN)
            throw IEX_NAMESPACE::ArgExc ("Invalid level rounding mode in image header.");

        if (lineOrder != INCREASING_Y &&
            lineOrder != DECREASING_Y &&
            lineOrder != RANDOM_Y)
            throw IEX_NAMESPACE::ArgExc ("Invalid line order in image header.");

        // computes size of chunk offset table. Throws an exception if this exceeds
        // the maximum allowable size
        getTiledChunkOffsetTableSize(*this);

    }
    else
    {
        if (lineOrder != INCREASING_Y &&
            lineOrder != DECREASING_Y)
            throw IEX_NAMESPACE::ArgExc ("Invalid line order in image header.");
        
        
    }

    //
    // The compression method must be one of the predefined values.
    //

    if (!isValidCompression (this->compression()))
  	throw IEX_NAMESPACE::ArgExc ("Unknown compression type in image header.");
    
    
    if( isDeep )
    {
        if (!isValidDeepCompression (this->compression()))
            throw IEX_NAMESPACE::ArgExc ("Compression type in header not valid for deep data");
    }

    //
    // Check the channel list:
    //
    // If the file is tiled then for each channel, the type must be one of the
    // predefined values, and the x and y sampling must both be 1.
    //
    // x and y sampling must currently also be 1 for deep scanline images
    //
    // If the file is not tiled then for each channel, the type must be one
    // of the predefined values, the x and y coordinates of the data window's
    // upper left corner must be divisible by the x and y subsampling factors,
    // and the width and height of the data window must be divisible by the
    // x and y subsampling factors.
    //

    const ChannelList &channels = this->channels();
    
    if (isTiled || isDeep)
    {
	for (ChannelList::ConstIterator i = channels.begin();
	     i != channels.end();
	     ++i)
	{
	    if (i.channel().type != OPENEXR_IMF_INTERNAL_NAMESPACE::UINT &&
		    i.channel().type != OPENEXR_IMF_INTERNAL_NAMESPACE::HALF &&
		    i.channel().type != OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "Pixel type of \"" << i.name() << "\" "
			            "image channel is invalid.");
	    }

	    if (i.channel().xSampling != 1)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "The x subsampling factor for the "
				    "\"" << i.name() << "\" channel "
				    "is not 1.");
	    }	

	    if (i.channel().ySampling != 1)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "The y subsampling factor for the "
				    "\"" << i.name() << "\" channel "
				    "is not 1.");
	    }	
	}
    }
    else
    {
	for (ChannelList::ConstIterator i = channels.begin();
	     i != channels.end();
	     ++i)
	{
	    if (i.channel().type != OPENEXR_IMF_INTERNAL_NAMESPACE::UINT &&
		    i.channel().type != OPENEXR_IMF_INTERNAL_NAMESPACE::HALF &&
		    i.channel().type != OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "Pixel type of \"" << i.name() << "\" "
			            "image channel is invalid.");
	    }

	    if (i.channel().xSampling < 1)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "The x subsampling factor for the "
				    "\"" << i.name() << "\" channel "
				    "is invalid.");
	    }

	    if (i.channel().ySampling < 1)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "The y subsampling factor for the "
				    "\"" << i.name() << "\" channel "
				    "is invalid.");
	    }

	    if (dataWindow.min.x % i.channel().xSampling)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "The minimum x coordinate of the "
				    "image's data window is not a multiple "
				    "of the x subsampling factor of "
				    "the \"" << i.name() << "\" channel.");
	    }

	    if (dataWindow.min.y % i.channel().ySampling)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "The minimum y coordinate of the "
				    "image's data window is not a multiple "
				    "of the y subsampling factor of "
				    "the \"" << i.name() << "\" channel.");
	    }

	    if ((dataWindow.max.x - dataWindow.min.x + 1) %
		    i.channel().xSampling)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "Number of pixels per row in the "
				    "image's data window is not a multiple "
				    "of the x subsampling factor of "
				    "the \"" << i.name() << "\" channel.");
	    }

	    if ((dataWindow.max.y - dataWindow.min.y + 1) %
		    i.channel().ySampling)
	    {
		THROW (IEX_NAMESPACE::ArgExc, "Number of pixels per column in the "
				    "image's data window is not a multiple "
				    "of the y subsampling factor of "
				    "the \"" << i.name() << "\" channel.");
	    }
	}
    }
}